

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

wchar_t utf8_ptr::s_getch_before(char *p,size_t ofs)

{
  byte bVar1;
  uint uVar2;
  wchar_t wVar3;
  uint uVar4;
  
  if (ofs != 0) {
    do {
      bVar1 = ((byte *)p)
              [-1 - (ulong)(~(uint)(((byte *)p)[-1] >> 6) & (uint)(((byte *)p)[-1] >> 7))];
      p = (char *)((byte *)p +
                   (-1 - (ulong)(~(uint)(((byte *)p)[-1] >> 6) & (uint)(((byte *)p)[-1] >> 7))) +
                  -(ulong)(~(uint)(bVar1 >> 6) & (uint)(bVar1 >> 7)));
      ofs = ofs - 1;
    } while (ofs != 0);
    wVar3 = s_getch(p);
    return wVar3;
  }
  bVar1 = *p;
  wVar3 = (wchar_t)bVar1;
  if (-1 < (char)bVar1) {
    return wVar3;
  }
  uVar4 = (byte)p[1] & 0x3f;
  if ((bVar1 & 0xe0) == 0xc0) {
    uVar2 = (wVar3 & 0x1fU) << 6;
  }
  else {
    uVar4 = uVar4 << 6 | (wVar3 & 0xfU) << 0xc;
    uVar2 = (byte)p[2] & 0x3f;
  }
  return uVar2 | uVar4;
}

Assistant:

static wchar_t s_getch_before(const char *p, size_t ofs)
    {
        /* skip backwards the given number of characters */
        for ( ; ofs != 0 ; --ofs)
        {
            /* 
             *   back up by one to three bytes, until we find no more
             *   continuation flags 
             */
            --p;
            p -= s_is_continuation(p);
            p -= s_is_continuation(p);
        }
        
        /* return the character at the current position */
        return s_getch(p);
    }